

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O2

void __thiscall test_app::test_buffer_size(test_app *this,bool async)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  ostream *poVar5;
  undefined7 in_register_00000031;
  char *pcVar6;
  string local_c0;
  string local_a0;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"- Test setbuf/flush ");
  pcVar6 = "sync";
  iVar2 = (int)CONCAT71(in_register_00000031,async);
  if (iVar2 != 0) {
    pcVar6 = "async";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  set_context(this,true,true);
  uVar4 = cppcms::application::response();
  cppcms::http::response::io_mode(uVar4,iVar2 * 2 + 1);
  bVar1 = (bool)cppcms::application::response();
  cppcms::http::response::full_asynchronous_buffering(bVar1);
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  str_abi_cxx11_(&local_38,this);
  std::__cxx11::string::~string((string *)&local_38);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"x");
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[x]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x7e);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar5 = (ostream *)cppcms::http::response::out();
  std::ostream::operator<<(poVar5,0x7b);
  str_abi_cxx11_(&local_a0,this);
  remove_brakets(&local_c0,&local_a0);
  std::__cxx11::string::string((string *)&local_58,"[123]",&local_79);
  remove_brakets(&local_78,&local_58);
  compare_strings(&local_c0,&local_78,0x80);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"abcdefg");
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[abcdefg]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x83);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar5 = (ostream *)cppcms::http::response::out();
  std::ostream::operator<<(poVar5,0x7c);
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x85);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[124]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x87);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'0');
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x89);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'1');
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x8b);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'2');
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x8d);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'3');
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x8f);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'4');
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[01234]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x91);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"xxx");
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[xxx]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0x94);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (async) {
    iVar2 = cppcms::application::response();
    cppcms::http::response::setbuf(iVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"-- fully/partially buffered mode");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::operator<<(poVar3,"12345678");
    str_abi_cxx11_(&local_c0,this);
    std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
    compare_strings(&local_c0,&local_a0,0x9a);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
    str_abi_cxx11_(&local_c0,this);
    std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
    compare_strings(&local_c0,&local_a0,0x9c);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    str_abi_cxx11_(&local_c0,this);
    std::__cxx11::string::string((string *)&local_a0,"[12345678]",(allocator *)&local_78);
    compare_strings(&local_c0,&local_a0,0x9e);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::operator<<(poVar3,"123");
    str_abi_cxx11_(&local_c0,this);
    std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_78);
    compare_strings(&local_c0,&local_a0,0xa1);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
    str_abi_cxx11_(&local_c0,this);
    std::__cxx11::string::string((string *)&local_a0,"[123]",(allocator *)&local_78);
    compare_strings(&local_c0,&local_a0,0xa4);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  cppcms::application::response();
  cppcms::http::response::finalize();
  str_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_a0,"[EOF]",(allocator *)&local_78);
  compare_strings(&local_c0,&local_a0,0xa7);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void test_buffer_size(bool async)
	{
		std::cout << "- Test setbuf/flush " << (async ? "async" : "sync")<< std::endl;
		set_context(true,true);
		if(async) {
			response().io_mode(cppcms::http::response::asynchronous);
		}
		else {
			response().io_mode(cppcms::http::response::nogzip);
		}
		response().full_asynchronous_buffering(false);
		response().out() << std::flush;
		response().setbuf(0);
		str();
		response().out() << "x";
		TEQ(str(),"[x]");
		response().out() << 123;
		TEQC(str(),"[123]");
		response().setbuf(4);
		response().out() << "abcdefg";
		TEQ(str(),"[abcdefg]");
		response().out() << 124;
		TEQ(str(),"");
		response().out() << std::flush;
		TEQ(str(),"[124]");
		response().out() << '0';
		TEQ(str(),"");
		response().out() << '1';
		TEQ(str(),"");
		response().out() << '2';
		TEQ(str(),"");
		response().out() << '3';
		TEQ(str(),"");
		response().out() << '4';
		TEQ(str(),"[01234]");
		response().out() << "xxx";
		response().setbuf(0);
		TEQ(str(),"[xxx]");
		if(async) {
			response().setbuf(4);
			std::cout<< "-- fully/partially buffered mode" << std::endl;
			response().full_asynchronous_buffering(true);
			response().out() << "12345678";
			TEQ(str(),"");
			response().out() << std::flush;
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			TEQ(str(),"[12345678]");
			response().full_asynchronous_buffering(true);
			response().out() << "123";
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			response().out() << std::flush;
			TEQ(str(),"[123]");
		}
		response().finalize();
		TEQ(str(),"[EOF]");
	}